

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O3

void __thiscall
timertt::details::
basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
::
activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
           *this,timer_holder *timer,duration<long,_std::ratio<1L,_1000000000L>_> pause,
          duration<long,_std::ratio<1L,_1000000000L>_> period,timer_action *action)

{
  reference_counter_type *prVar1;
  _Manager_type p_Var2;
  bool bVar3;
  lock_guard locker;
  timer_object_holder<timertt::thread_safety::safe> local_70;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type local_50;
  unique_lock<std::mutex> local_40;
  
  local_40._M_owns = false;
  local_40._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  thread_mixin::ensure_started((thread_mixin *)this);
  local_70.m_timer = timer->m_timer;
  timer->m_timer = (timer_object<timertt::thread_safety::safe> *)0x0;
  local_58 = (_Manager_type)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = action->_M_invoker;
  p_Var2 = (action->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_68._M_unused._0_8_ = (undefined8)*(undefined8 *)&(action->super__Function_base)._M_functor
    ;
    local_68._8_8_ = *(undefined8 *)((long)&(action->super__Function_base)._M_functor + 8);
    (action->super__Function_base)._M_manager = (_Manager_type)0x0;
    action->_M_invoker = (_Invoker_type)0x0;
    local_58 = p_Var2;
  }
  bVar3 = timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>
          ::
          activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    ((timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>
                      *)(this + 0x68),&local_70,pause,period,(timer_action *)&local_68);
  if (local_58 != (_Manager_type)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (local_70.m_timer != (timer_object<timertt::thread_safety::safe> *)0x0) {
    LOCK();
    prVar1 = &(local_70.m_timer)->m_references;
    (prVar1->super___atomic_base<unsigned_int>)._M_i =
         (prVar1->super___atomic_base<unsigned_int>)._M_i - 1;
    UNLOCK();
    if ((prVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
      (*(local_70.m_timer)->_vptr_timer_object[1])();
    }
    local_70.m_timer = (timer_object<timertt::thread_safety::safe> *)0x0;
  }
  if (bVar3) {
    std::condition_variable::notify_one();
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void
	activate(
		//! Timer to be activated.
		timer_holder timer,
		//! Pause for timer execution.
		DURATION_1 pause,
		//! Repetition period.
		//! If <tt>DURATION_2::zero() == period</tt> then timer will be
		//! single-shot.
		DURATION_2 period,
		//! Action for the timer.
		timer_action action )
	{
		typename mixin_type::lock_guard locker{ *this };

		this->ensure_started();

		if( m_engine.activate(
				std::move( timer ), pause, period, std::move( action ) ) )
			this->notify();
	}